

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

ThreadContext * __thiscall
PoolList<Future<void>::Private::ThreadPool::ThreadContext>::linkFreeItem
          (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this,ThreadContext *t)

{
  Item *pIVar1;
  Item *pIVar2;
  PoolList<Future<void>::Private::ThreadPool::ThreadContext> *pPVar3;
  
  pIVar1 = (this->_end).item;
  pIVar2 = this->freeItem;
  this->freeItem = pIVar2->prev;
  pPVar3 = (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *)pIVar1->prev;
  pIVar2->prev = (Item *)pPVar3;
  if (pPVar3 == (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *)0x0) {
    pPVar3 = this;
  }
  (pPVar3->_begin).item = pIVar2;
  pIVar2->next = pIVar1;
  pIVar1->prev = pIVar2;
  this->_size = this->_size + 1;
  return t;
}

Assistant:

T& linkFreeItem(T* t)
  {
    Item* item = freeItem;
    freeItem = item->prev;
    Item* insertPos = _end.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;
    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return *t;
  }